

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O0

bool sfc::bpp_allowed_for_mode(uint bpp,Mode mode)

{
  code *pcVar1;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  Mode mode_local;
  uint bpp_local;
  
  switch(mode) {
  case none:
    mode_local._3_1_ = none >> 0x18;
    break;
  case snes:
    local_21 = true;
    if ((bpp != 2) && (local_21 = true, bpp != 4)) {
      local_21 = bpp == 8;
    }
    mode_local._3_1_ = local_21;
    break;
  case snes_mode7:
    mode_local._3_1_ = bpp == 8;
    break;
  case gb:
  case gbc:
  case ws:
  case ngp:
    local_22 = bpp == 1 || bpp == 2;
    mode_local._3_1_ = local_22;
    break;
  case gba:
    local_24 = bpp == 4 || bpp == 8;
    mode_local._3_1_ = local_24;
    break;
  case gba_affine:
    mode_local._3_1_ = bpp == 8;
    break;
  case md:
  case pce:
  case pce_sprite:
  case wsc_packed:
  case sms:
  case gg:
    mode_local._3_1_ = bpp == 4;
    break;
  case wsc:
    local_23 = bpp == 2 || bpp == 4;
    mode_local._3_1_ = local_23;
    break;
  case ngpc:
    mode_local._3_1_ = bpp == 2;
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return (bool)mode_local._3_1_;
}

Assistant:

constexpr bool bpp_allowed_for_mode(unsigned bpp, Mode mode) {
  switch (mode) {
  case Mode::snes:
    return bpp == 2 || bpp == 4 || bpp == 8;
  case Mode::snes_mode7:
    return bpp == 8;
  case Mode::gb:
  case Mode::gbc:
  case Mode::ngp:
  case Mode::ws:
    return bpp == 1 || bpp == 2;
  case Mode::wsc:
    return bpp == 2 || bpp == 4;
  case Mode::gba:
    return bpp == 4 || bpp == 8;
  case Mode::gba_affine:
    return bpp == 8;
  case Mode::md:
  case Mode::pce:
  case Mode::pce_sprite:
  case Mode::wsc_packed:
  case Mode::sms:
  case Mode::gg:
    return bpp == 4;
  case Mode::ngpc:
    return bpp == 2;
  case Mode::none:
    return false;
  }
}